

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_script_push_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  _Bool _Var1;
  leint16_t lVar2;
  leint32_t lVar3;
  size_t sVar4;
  leint32_t data_len_1;
  leint16_t data_len;
  int ret;
  size_t opcode_len;
  uchar buff [32];
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  size_t sStack_20;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  data_len_1 = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((bytes_len == 0) || (bytes != (uchar *)0x0)) && (_Var1 = script_flags_ok(flags,0), _Var1))
     && (((bytes_out != (uchar *)0x0 && (len != 0)) && (written != (size_t *)0x0)))) {
    if ((flags & 1) == 0) {
      sStack_20 = bytes_len;
      bytes_len_local = (size_t)bytes;
      if ((flags & 2) != 0) {
        data_len_1 = wally_sha256(bytes,bytes_len,(uchar *)&opcode_len,0x20);
        bytes_len_local = (size_t)&opcode_len;
        sStack_20 = 0x20;
      }
    }
    else {
      data_len_1 = wally_hash160(bytes,bytes_len,(uchar *)&opcode_len,0x14);
      bytes_len_local = (size_t)&opcode_len;
      sStack_20 = 0x14;
    }
    if (data_len_1 == 0) {
      sVar4 = calc_push_opcode_size(sStack_20);
      *written = sStack_20 + sVar4;
      if (len < *written) {
        return 0;
      }
      if (sStack_20 < 0x4c) {
        *bytes_out = (uchar)sStack_20;
      }
      else if (sStack_20 < 0x100) {
        *bytes_out = 'L';
        bytes_out[1] = (uchar)sStack_20;
      }
      else if (sStack_20 < 0x10000) {
        lVar2 = cpu_to_le16((uint16_t)sStack_20);
        *bytes_out = 'M';
        *(leint16_t *)(bytes_out + 1) = lVar2;
      }
      else {
        lVar3 = cpu_to_le32((uint32_t)sStack_20);
        *bytes_out = 'N';
        *(leint32_t *)(bytes_out + 1) = lVar3;
      }
      if (sStack_20 != 0) {
        memcpy(bytes_out + sVar4,(void *)bytes_len_local,sStack_20);
      }
    }
    wally_clear(&opcode_len,0x20);
    bytes_local._4_4_ = data_len_1;
  }
  else {
    bytes_local._4_4_ = 0xfffffffe;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_script_push_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char buff[SHA256_LEN];
    size_t opcode_len;
    int ret = WALLY_OK;

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) || !script_flags_ok(flags, 0) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & WALLY_SCRIPT_HASH160) {
        ret = wally_hash160(bytes, bytes_len, buff, HASH160_LEN);
        bytes = buff;
        bytes_len = HASH160_LEN;
    } else if (flags & WALLY_SCRIPT_SHA256) {
        ret = wally_sha256(bytes, bytes_len, buff, SHA256_LEN);
        bytes = buff;
        bytes_len = SHA256_LEN;
    }
    if (ret != WALLY_OK)
        goto cleanup;

    opcode_len = calc_push_opcode_size(bytes_len);

    *written = bytes_len + opcode_len;
    if (len < *written)
        return WALLY_OK; /* Caller needs to pass a bigger buffer */

    if (bytes_len < 76)
        bytes_out[0] = bytes_len;
    else if (bytes_len < 256) {
        bytes_out[0] = OP_PUSHDATA1;
        bytes_out[1] = bytes_len;
    } else if (bytes_len < 65536) {
        leint16_t data_len = cpu_to_le16(bytes_len);
        bytes_out[0] = OP_PUSHDATA2;
        memcpy(bytes_out + 1, &data_len, sizeof(data_len));
    } else {
        leint32_t data_len = cpu_to_le32(bytes_len);
        bytes_out[0] = OP_PUSHDATA4;
        memcpy(bytes_out + 1, &data_len, sizeof(data_len));
    }
    if (bytes_len)
        memcpy(bytes_out + opcode_len, bytes, bytes_len);

cleanup:
    wally_clear(buff, sizeof(buff));
    return ret;
}